

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

GLuint deqp::gls::LifetimeTests::details::replaceName(Type *type,GLuint oldName,TestLog *log)

{
  int iVar1;
  undefined4 extraout_var;
  MessageBuilder *pMVar2;
  byte local_1c5;
  MessageBuilder local_1b8;
  byte local_31;
  long *plStack_30;
  bool genRequired;
  Binder *binder;
  TestLog *log_local;
  Type *pTStack_18;
  GLuint oldName_local;
  Type *type_local;
  
  binder = (Binder *)log;
  log_local._4_4_ = oldName;
  pTStack_18 = type;
  iVar1 = (*type->_vptr_Type[6])();
  plStack_30 = (long *)CONCAT44(extraout_var,iVar1);
  local_1c5 = 1;
  if (plStack_30 != (long *)0x0) {
    local_1c5 = (**(code **)(*plStack_30 + 0x20))();
  }
  local_31 = local_1c5 & 1;
  if (local_31 == 0) {
    tcu::TestLog::operator<<
              (&local_1b8,(TestLog *)binder,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [59])"// Type does not require Gen* for binding, reusing old id ")
    ;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)((long)&log_local + 4));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0xab9922);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    type_local._4_4_ = log_local._4_4_;
  }
  else {
    type_local._4_4_ = (*pTStack_18->_vptr_Type[2])();
  }
  return type_local._4_4_;
}

Assistant:

GLuint replaceName (Type& type, GLuint oldName, TestLog& log)
{
	const Binder* const	binder		= type.binder();
	const bool			genRequired	= binder == DE_NULL || binder->genRequired();

	if (genRequired)
		return type.gen();

	log << TestLog::Message
		<< "// Type does not require Gen* for binding, reusing old id " << oldName << "."
		<< TestLog::EndMessage;

	return oldName;
}